

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

Move * move_create(MOVETYPE type,SPOTTYPE fromSpotType,uchar fromSpotIndex,int fromSpotCardIndex,
                  SPOTTYPE toSpotType,uchar toSpotIndex,int toSpotCardIndex)

{
  Move *pMVar1;
  
  pMVar1 = (Move *)malloc(0x18);
  pMVar1->type = type;
  pMVar1->fromSpotType = fromSpotType;
  pMVar1->fromSpotIndex = fromSpotIndex;
  pMVar1->fromSpotCardIndex = fromSpotCardIndex;
  pMVar1->toSpotType = toSpotType;
  pMVar1->toSpotIndex = toSpotIndex;
  pMVar1->toSpotCardIndex = toSpotCardIndex;
  pMVar1->movePack = (_MovePack *)0x0;
  return pMVar1;
}

Assistant:

Move * move_create(MOVETYPE type, SPOTTYPE fromSpotType, unsigned char fromSpotIndex, int fromSpotCardIndex, SPOTTYPE toSpotType, unsigned char toSpotIndex, int toSpotCardIndex)
{
	Move * move = (Move *)malloc(sizeof(Move));
	move->type = type;
	move->fromSpotType = fromSpotType;
	move->fromSpotIndex = fromSpotIndex;
	move->fromSpotCardIndex = fromSpotCardIndex;
	move->toSpotType = toSpotType;
	move->toSpotIndex = toSpotIndex;
	move->toSpotCardIndex = toSpotCardIndex;
	move->movePack = 0;

	return move;
}